

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O0

DOMNodeIteratorImpl * __thiscall
xercesc_4_0::DOMNodeIteratorImpl::operator=(DOMNodeIteratorImpl *this,DOMNodeIteratorImpl *other)

{
  DOMNodeIteratorImpl *other_local;
  DOMNodeIteratorImpl *this_local;
  
  this->fRoot = other->fRoot;
  this->fCurrentNode = other->fRoot;
  this->fWhatToShow = other->fWhatToShow;
  this->fNodeFilter = other->fNodeFilter;
  this->fForward = (bool)(other->fForward & 1);
  this->fDetached = (bool)(other->fDetached & 1);
  this->fExpandEntityReferences = (bool)(other->fExpandEntityReferences & 1);
  this->fDocument = other->fDocument;
  return this;
}

Assistant:

DOMNodeIteratorImpl& DOMNodeIteratorImpl::operator= (const DOMNodeIteratorImpl& other) {
    fRoot                   = other.fRoot;
    fCurrentNode            = other.fRoot;
    fWhatToShow             = other.fWhatToShow;
    fNodeFilter             = other.fNodeFilter;
    fForward                = other.fForward;
    fDetached               = other.fDetached;
    fExpandEntityReferences = other.fExpandEntityReferences;
    fDocument               = other.fDocument;
    return *this;
}